

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void decode_token_recon_block(AV1Decoder *pbi,ThreadData *td,aom_reader *r,BLOCK_SIZE bsize)

{
  AV1_COMMON *cm;
  BLOCK_SIZE plane_bsize;
  byte bVar1;
  int iVar2;
  int iVar3;
  MB_MODE_INFO *pMVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int eobtotal;
  AV1Decoder *local_38;
  
  cm = &pbi->common;
  uVar17 = (uint)(((pbi->common).seq_params)->monochrome == '\0') * 2 + 1;
  pMVar4 = *(td->dcb).xd.mi;
  local_38 = pbi;
  if (((pMVar4->field_0xa7 & 0x80) == 0) && (pMVar4->ref_frame[0] < '\x01')) {
    iVar6 = max_block_wide((MACROBLOCKD *)td,bsize,0);
    iVar7 = max_block_high((MACROBLOCKD *)td,bsize,0);
    iVar15 = 0x10;
    if (iVar6 < 0x10) {
      iVar15 = iVar6;
    }
    iVar11 = 0x10;
    if (iVar7 < 0x10) {
      iVar11 = iVar7;
    }
    iVar8 = 0;
    while (iVar21 = iVar8, iVar21 < iVar7) {
      iVar8 = iVar11 + iVar21;
      iVar12 = iVar7;
      if (iVar8 < iVar7) {
        iVar12 = iVar8;
      }
      iVar9 = 0;
      while (iVar13 = iVar9, iVar13 < iVar6) {
        iVar9 = iVar15 + iVar13;
        iVar14 = iVar6;
        if (iVar9 < iVar6) {
          iVar14 = iVar9;
        }
        uVar20 = 0;
        while ((uVar20 != uVar17 && ((uVar20 == 0 || ((td->dcb).xd.is_chroma_ref == true))))) {
          pMVar4 = *(td->dcb).xd.mi;
          if ((td->dcb).xd.lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0) {
            if (uVar20 == 0) {
              bVar5 = pMVar4->tx_size;
            }
            else {
              bVar5 = av1_get_max_uv_txsize
                                (pMVar4->bsize,(td->dcb).xd.plane[uVar20].subsampling_x,
                                 (td->dcb).xd.plane[uVar20].subsampling_y);
            }
          }
          else {
            bVar5 = 0;
          }
          iVar2 = *(int *)((long)tx_size_high_unit + (ulong)((uint)bVar5 * 4));
          bVar10 = (byte)(td->dcb).xd.plane[uVar20].subsampling_y;
          bVar1 = (byte)(td->dcb).xd.plane[uVar20].subsampling_x;
          iVar3 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)bVar5 * 4));
          for (iVar16 = iVar21 >> (bVar10 & 0x1f);
              iVar16 < ((1 << (bVar10 & 0x1f)) >> 1) + iVar12 >> (bVar10 & 0x1f);
              iVar16 = iVar16 + iVar2) {
            for (iVar22 = iVar13 >> ((byte)(td->dcb).xd.plane[uVar20].subsampling_x & 0x1f);
                iVar22 < ((1 << (bVar1 & 0x1f)) >> 1) + iVar14 >> (bVar1 & 0x1f);
                iVar22 = iVar22 + iVar3) {
              iVar19 = (int)uVar20;
              (*td->read_coeffs_tx_intra_block_visit)(cm,&td->dcb,r,iVar19,iVar16,iVar22,bVar5);
              (*td->predict_and_recon_intra_block_visit)(cm,&td->dcb,r,iVar19,iVar16,iVar22,bVar5);
              set_cb_buffer_offsets(&td->dcb,bVar5,iVar19);
            }
          }
          uVar20 = uVar20 + 1;
        }
      }
    }
  }
  else {
    (*td->predict_inter_block_visit)(cm,&td->dcb,bsize);
    if (pMVar4->skip_txfm == '\0') {
      eobtotal = 0;
      iVar6 = max_block_wide((MACROBLOCKD *)td,bsize,0);
      iVar7 = max_block_high((MACROBLOCKD *)td,bsize,0);
      iVar15 = 0x10;
      if (iVar6 < 0x10) {
        iVar15 = iVar6;
      }
      iVar11 = 0x10;
      if (iVar7 < 0x10) {
        iVar11 = iVar7;
      }
      iVar8 = 0;
      while (iVar21 = iVar8, iVar21 < iVar7) {
        iVar8 = iVar11 + iVar21;
        iVar12 = iVar7;
        if (iVar8 < iVar7) {
          iVar12 = iVar8;
        }
        iVar9 = 0;
        while (iVar13 = iVar9, iVar13 < iVar6) {
          iVar9 = iVar15 + iVar13;
          iVar14 = iVar6;
          if (iVar9 < iVar6) {
            iVar14 = iVar9;
          }
          uVar20 = 0;
          while ((uVar20 != uVar17 && ((uVar20 == 0 || ((td->dcb).xd.is_chroma_ref == true))))) {
            iVar2 = (td->dcb).xd.plane[uVar20].subsampling_x;
            iVar3 = (td->dcb).xd.plane[uVar20].subsampling_y;
            plane_bsize = av1_ss_size_lookup[bsize][iVar2][iVar3];
            iVar16 = 0;
            uVar18 = 0;
            if ((td->dcb).xd.lossless[*(ushort *)&(*(td->dcb).xd.mi)->field_0xa7 & 7] == 0) {
              bVar5 = ""[plane_bsize];
              if (uVar20 != 0) {
                bVar5 = av1_get_adjusted_tx_size(bVar5);
              }
              uVar18 = (uint)bVar5;
            }
            bVar10 = (byte)iVar3;
            bVar5 = (byte)iVar2;
            iVar2 = *(int *)((long)tx_size_high_unit + (ulong)(uVar18 << 2));
            iVar3 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar18 << 2));
            for (iVar22 = iVar21 >> (bVar10 & 0x1f); iVar19 = iVar13 >> (bVar5 & 0x1f),
                iVar22 < ((1 << (bVar10 & 0x1f)) >> 1) + iVar12 >> (bVar10 & 0x1f);
                iVar22 = iVar22 + iVar2) {
              for (; iVar19 < ((1 << (bVar5 & 0x1f)) >> 1) + iVar14 >> (bVar5 & 0x1f);
                  iVar19 = iVar19 + iVar3) {
                decode_reconstruct_tx
                          (cm,td,r,pMVar4,(int)uVar20,plane_bsize,iVar22,iVar19,iVar16,
                           (TX_SIZE)uVar18,&eobtotal);
                iVar16 = iVar16 + iVar3 * iVar2;
              }
            }
            uVar20 = uVar20 + 1;
          }
        }
      }
    }
    (*td->cfl_store_inter_block_visit)(cm,(MACROBLOCKD *)td);
  }
  av1_visit_palette(local_38,(MACROBLOCKD *)td,r,set_color_index_map_offset);
  return;
}

Assistant:

static inline void decode_token_recon_block(AV1Decoder *const pbi,
                                            ThreadData *const td, aom_reader *r,
                                            BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &pbi->common;
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *mbmi = xd->mi[0];

  if (!is_inter_block(mbmi)) {
    int row, col;
    assert(bsize == get_plane_block_size(bsize, xd->plane[0].subsampling_x,
                                         xd->plane[0].subsampling_y));
    const int max_blocks_wide = max_block_wide(xd, bsize, 0);
    const int max_blocks_high = max_block_high(xd, bsize, 0);
    const BLOCK_SIZE max_unit_bsize = BLOCK_64X64;
    int mu_blocks_wide = mi_size_wide[max_unit_bsize];
    int mu_blocks_high = mi_size_high[max_unit_bsize];
    mu_blocks_wide = AOMMIN(max_blocks_wide, mu_blocks_wide);
    mu_blocks_high = AOMMIN(max_blocks_high, mu_blocks_high);

    for (row = 0; row < max_blocks_high; row += mu_blocks_high) {
      for (col = 0; col < max_blocks_wide; col += mu_blocks_wide) {
        for (int plane = 0; plane < num_planes; ++plane) {
          if (plane && !xd->is_chroma_ref) break;
          const struct macroblockd_plane *const pd = &xd->plane[plane];
          const TX_SIZE tx_size = av1_get_tx_size(plane, xd);
          const int stepr = tx_size_high_unit[tx_size];
          const int stepc = tx_size_wide_unit[tx_size];

          const int unit_height = ROUND_POWER_OF_TWO(
              AOMMIN(mu_blocks_high + row, max_blocks_high), pd->subsampling_y);
          const int unit_width = ROUND_POWER_OF_TWO(
              AOMMIN(mu_blocks_wide + col, max_blocks_wide), pd->subsampling_x);

          for (int blk_row = row >> pd->subsampling_y; blk_row < unit_height;
               blk_row += stepr) {
            for (int blk_col = col >> pd->subsampling_x; blk_col < unit_width;
                 blk_col += stepc) {
              td->read_coeffs_tx_intra_block_visit(cm, dcb, r, plane, blk_row,
                                                   blk_col, tx_size);
              td->predict_and_recon_intra_block_visit(
                  cm, dcb, r, plane, blk_row, blk_col, tx_size);
              set_cb_buffer_offsets(dcb, tx_size, plane);
            }
          }
        }
      }
    }
  } else {
    td->predict_inter_block_visit(cm, dcb, bsize);
    // Reconstruction
    if (!mbmi->skip_txfm) {
      int eobtotal = 0;

      const int max_blocks_wide = max_block_wide(xd, bsize, 0);
      const int max_blocks_high = max_block_high(xd, bsize, 0);
      int row, col;

      const BLOCK_SIZE max_unit_bsize = BLOCK_64X64;
      assert(max_unit_bsize ==
             get_plane_block_size(BLOCK_64X64, xd->plane[0].subsampling_x,
                                  xd->plane[0].subsampling_y));
      int mu_blocks_wide = mi_size_wide[max_unit_bsize];
      int mu_blocks_high = mi_size_high[max_unit_bsize];

      mu_blocks_wide = AOMMIN(max_blocks_wide, mu_blocks_wide);
      mu_blocks_high = AOMMIN(max_blocks_high, mu_blocks_high);

      for (row = 0; row < max_blocks_high; row += mu_blocks_high) {
        for (col = 0; col < max_blocks_wide; col += mu_blocks_wide) {
          for (int plane = 0; plane < num_planes; ++plane) {
            if (plane && !xd->is_chroma_ref) break;
            const struct macroblockd_plane *const pd = &xd->plane[plane];
            const int ss_x = pd->subsampling_x;
            const int ss_y = pd->subsampling_y;
            const BLOCK_SIZE plane_bsize =
                get_plane_block_size(bsize, ss_x, ss_y);
            const TX_SIZE max_tx_size =
                get_vartx_max_txsize(xd, plane_bsize, plane);
            const int bh_var_tx = tx_size_high_unit[max_tx_size];
            const int bw_var_tx = tx_size_wide_unit[max_tx_size];
            int block = 0;
            int step =
                tx_size_wide_unit[max_tx_size] * tx_size_high_unit[max_tx_size];
            int blk_row, blk_col;
            const int unit_height = ROUND_POWER_OF_TWO(
                AOMMIN(mu_blocks_high + row, max_blocks_high), ss_y);
            const int unit_width = ROUND_POWER_OF_TWO(
                AOMMIN(mu_blocks_wide + col, max_blocks_wide), ss_x);

            for (blk_row = row >> ss_y; blk_row < unit_height;
                 blk_row += bh_var_tx) {
              for (blk_col = col >> ss_x; blk_col < unit_width;
                   blk_col += bw_var_tx) {
                decode_reconstruct_tx(cm, td, r, mbmi, plane, plane_bsize,
                                      blk_row, blk_col, block, max_tx_size,
                                      &eobtotal);
                block += step;
              }
            }
          }
        }
      }
    }
    td->cfl_store_inter_block_visit(cm, xd);
  }

  av1_visit_palette(pbi, xd, r, set_color_index_map_offset);
}